

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassToObject
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  long lVar1;
  bool bVar2;
  GeneratorOptions *pGVar3;
  int iVar4;
  char *pcVar5;
  Descriptor *in_R8;
  long lVar6;
  long lVar7;
  string local_80;
  GeneratorOptions *local_60;
  Generator *local_58;
  string local_50;
  
  local_60 = options;
  local_58 = this;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_80,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print(printer,
                     "\n\nif (jspb.Message.GENERATE_TO_OBJECT) {\n/**\n * Creates an object representation of this proto suitable for use in Soy templates.\n * Field names that are reserved in JavaScript and will be renamed to pb_name.\n * To access a reserved field use, foo.pb_<name>, eg, foo.pb_default.\n * For the list of reserved names please see:\n *     com.google.apps.jspb.JsClassTemplate.JS_RESERVED_WORDS.\n * @param {boolean=} opt_includeInstance Whether to include the JSPB instance\n *     for transitional soy proto support: http://goto/soy-param-migration\n * @return {!Object}\n */\n$classname$.prototype.toObject = function(opt_includeInstance) {\n  return $classname$.toObject(opt_includeInstance, this);\n};\n\n\n/**\n * Static version of the {@see toObject} method.\n * @param {boolean|undefined} includeInstance Whether to include the JSPB\n *     instance for transitional soy proto support:\n *     http://goto/soy-param-migration\n * @param {!$classname$} msg The msg instance to transform.\n * @return {!Object}\n */\n$classname$.toObject = function(includeInstance, msg) {\n  var f, obj = {"
                     ,"classname",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)(desc + 0x2c)) {
    bVar2 = true;
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(desc + 0x30);
      if ((*(char *)(lVar1 + 0x50 + lVar7) != '\x01') ||
         (iVar4 = std::__cxx11::string::compare
                            ((char *)**(undefined8 **)(*(long *)(lVar1 + 0x58 + lVar7) + 0x10)),
         iVar4 != 0)) {
        pcVar5 = ",\n    ";
        if (bVar2) {
          pcVar5 = "\n    ";
          bVar2 = false;
        }
        io::Printer::Print(printer,pcVar5);
        GenerateClassFieldToObject(local_58,local_60,printer,(FieldDescriptor *)(lVar1 + lVar7));
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0xa8;
    } while (lVar6 < *(int *)(desc + 0x2c));
    if (!bVar2) {
      pcVar5 = "\n  };\n\n";
      goto LAB_00220026;
    }
  }
  pcVar5 = "\n\n  };\n\n";
LAB_00220026:
  io::Printer::Print(printer,pcVar5);
  pGVar3 = local_60;
  if (0 < *(int *)(desc + 0x68)) {
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&local_80,(_anonymous_namespace_ *)local_60,*(GeneratorOptions **)(desc + 0x10),
               (FileDescriptor *)desc,in_R8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(pGVar3->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(pGVar3->namespace_prefix)._M_string_length,desc);
    io::Printer::Print(printer,
                       "  jspb.Message.toObjectExtension(/** @type {!jspb.Message} */ (msg), obj,\n      $extObject$, $class$.prototype.getExtension,\n      includeInstance);\n"
                       ,"extObject",&local_80,"class",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_80,(_anonymous_namespace_ *)(local_60->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(local_60->namespace_prefix)._M_string_length,desc);
  io::Printer::Print(printer,
                     "  if (includeInstance) {\n    obj.$$jspbMessageInstance = msg;\n  }\n  return obj;\n};\n}\n\n\n"
                     ,"classname",&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::GenerateClassToObject(const GeneratorOptions& options,
                                      io::Printer* printer,
                                      const Descriptor* desc) const {
  printer->Print(
      "\n"
      "\n"
      "if (jspb.Message.GENERATE_TO_OBJECT) {\n"
      "/**\n"
      " * Creates an object representation of this proto suitable for use in "
      "Soy templates.\n"
      " * Field names that are reserved in JavaScript and will be renamed to "
      "pb_name.\n"
      " * To access a reserved field use, foo.pb_<name>, eg, foo.pb_default.\n"
      " * For the list of reserved names please see:\n"
      " *     com.google.apps.jspb.JsClassTemplate.JS_RESERVED_WORDS.\n"
      " * @param {boolean=} opt_includeInstance Whether to include the JSPB "
      "instance\n"
      " *     for transitional soy proto support: http://goto/soy-param-"
      "migration\n"
      " * @return {!Object}\n"
      " */\n"
      "$classname$.prototype.toObject = function(opt_includeInstance) {\n"
      "  return $classname$.toObject(opt_includeInstance, this);\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Static version of the {@see toObject} method.\n"
      " * @param {boolean|undefined} includeInstance Whether to include the "
      "JSPB\n"
      " *     instance for transitional soy proto support:\n"
      " *     http://goto/soy-param-migration\n"
      " * @param {!$classname$} msg The msg instance to transform.\n"
      " * @return {!Object}\n"
      " */\n"
      "$classname$.toObject = function(includeInstance, msg) {\n"
      "  var f, obj = {",
      "classname", GetMessagePath(options, desc));

  bool first = true;
  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    if (IgnoreField(field)) {
      continue;
    }

    if (!first) {
      printer->Print(",\n    ");
    } else {
      printer->Print("\n    ");
      first = false;
    }

    GenerateClassFieldToObject(options, printer, field);
  }

  if (!first) {
    printer->Print("\n  };\n\n");
  } else {
    printer->Print("\n\n  };\n\n");
  }

  if (IsExtendable(desc)) {
    printer->Print(
        "  jspb.Message.toObjectExtension(/** @type {!jspb.Message} */ (msg), "
        "obj,\n"
        "      $extObject$, $class$.prototype.getExtension,\n"
        "      includeInstance);\n",
        "extObject", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  }

  printer->Print(
      "  if (includeInstance) {\n"
      "    obj.$$jspbMessageInstance = msg;\n"
      "  }\n"
      "  return obj;\n"
      "};\n"
      "}\n"
      "\n"
      "\n",
      "classname", GetMessagePath(options, desc));
}